

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_adaptor.cpp
# Opt level: O2

void __thiscall
nivalis::ImGuiDrawListGraphicsAdaptor::rectangle
          (ImGuiDrawListGraphicsAdaptor *this,float x,float y,float w,float h,bool fill,color *c,
          float thickness)

{
  ImDrawList *this_00;
  ImU32 IVar1;
  undefined7 in_register_00000031;
  ImVec2 local_38;
  ImVec2 local_30;
  ImVec4 local_28;
  
  this_00 = this->draw_list;
  local_38.x = w + x;
  local_38.y = h + y;
  local_30.x = x;
  local_30.y = y;
  if ((int)CONCAT71(in_register_00000031,fill) == 0) {
    local_28.x = *c->r;
    local_28.y = *c->g;
    local_28.z = *c->b;
    local_28.w = *c->a;
    IVar1 = ImGui::ColorConvertFloat4ToU32(&local_28);
    ImDrawList::AddRect(this_00,&local_30,&local_38,IVar1,0.0,0xf,thickness);
  }
  else {
    local_28.x = *c->r;
    local_28.y = *c->g;
    local_28.z = *c->b;
    local_28.w = *c->a;
    IVar1 = ImGui::ColorConvertFloat4ToU32(&local_28);
    ImDrawList::AddRectFilled(this_00,&local_30,&local_38,IVar1,0.0,0xf);
  }
  return;
}

Assistant:

void ImGuiDrawListGraphicsAdaptor::rectangle(float x, float y, float w, float h,
                                             bool fill, const color::color& c,
                                             float thickness) {
    if (fill) {
        draw_list->AddRectFilled(ImVec2(x, y), ImVec2(x + w, y + h),
                                 ImColor(c.r, c.g, c.b, c.a));
    } else {
        draw_list->AddRect(ImVec2(x, y), ImVec2(x + w, y + h),
                           ImColor(c.r, c.g, c.b, c.a), 0.0f,
                           ImDrawCornerFlags_All, thickness);
    }
}